

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O1

int __thiscall N::connect(N *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long *plVar1;
  pointer *pppNVar2;
  pointer puVar3;
  N **ppNVar4;
  iterator __position;
  iterator __position_00;
  uint extraout_EAX;
  long lVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined4 in_register_00000034;
  long lVar10;
  uint uVar11;
  difference_type s;
  uint uVar13;
  ulong uVar14;
  long in_stack_00000008;
  long in_stack_00000010;
  long *in_stack_00000020;
  N *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 *puStack_58;
  long local_50;
  long local_40;
  long lVar12;
  
  local_78 = (N *)CONCAT44(in_register_00000034,__fd);
  lVar12 = in_stack_00000010 - in_stack_00000008 >> 3;
  uVar11 = (uint)lVar12;
  lVar5 = lVar12;
  plVar6 = in_stack_00000020;
  uVar13 = uVar11;
  if (in_stack_00000020 != (long *)0x0) {
    do {
      plVar1 = plVar6 + 3;
      lVar5 = lVar5 + (plVar6[1] - *plVar6 >> 3);
      uVar13 = (uint)lVar5;
      plVar6 = (long *)*plVar1;
    } while ((long *)*plVar1 != (long *)0x0);
  }
  if (uVar13 != 0) {
    ppNVar4 = (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    lVar5 = (long)__position._M_current - (long)ppNVar4 >> 3;
    uVar14 = 0;
    if (__position._M_current == ppNVar4) {
      lVar8 = 0;
    }
    else {
      lVar10 = lVar5 + (ulong)(lVar5 == 0);
      lVar7 = 0;
      do {
        uVar13 = (uint)uVar14;
        lVar8 = lVar7;
        if (ppNVar4[lVar7] == local_78) break;
        uVar13 = uVar13 + (this->osi).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7];
        uVar14 = (ulong)uVar13;
        lVar7 = lVar7 + 1;
        lVar8 = lVar10;
      } while (lVar10 != lVar7);
      uVar14 = (ulong)(int)uVar13;
    }
    if (lVar5 == lVar8) {
      if (__position._M_current ==
          (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<N*,std::allocator<N*>>::_M_realloc_insert<N*const&>
                  ((vector<N*,std::allocator<N*>> *)&this->ps,__position,&local_78);
      }
      else {
        *__position._M_current = local_78;
        pppNVar2 = &(this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar2 = *pppNVar2 + 1;
      }
      if (in_stack_00000020 != (long *)0x0) {
        do {
          plVar6 = in_stack_00000020 + 1;
          lVar5 = *in_stack_00000020;
          in_stack_00000020 = (long *)in_stack_00000020[3];
          lVar12 = lVar12 + (*plVar6 - lVar5 >> 3);
          uVar11 = (uint)lVar12;
        } while (in_stack_00000020 != (long *)0x0);
      }
      local_70 = CONCAT44(local_70._4_4_,uVar11);
      __position_00._M_current =
           (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->osi,__position_00,(uint *)&local_70);
      }
      else {
        *__position_00._M_current = uVar11;
        (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
    }
    else {
      puVar3 = (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar8;
      *puVar3 = *puVar3 + 1;
    }
    puStack_58 = &stack0x00000008;
    do {
      puVar9 = puStack_58;
      puStack_58 = (undefined8 *)puVar9[3];
    } while (puStack_58 != (undefined8 *)0x0);
    local_70 = *puVar9;
    uStack_68 = puVar9[1];
    local_50 = in_stack_00000008;
    local_40 = in_stack_00000008;
    local_60 = uStack_68;
    std::vector<N*,std::allocator<N*>>::
    _M_range_insert<CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>>
              ((vector<N*,std::allocator<N*>> *)&this->os,
               (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14);
    uVar13 = extraout_EAX;
  }
  return uVar13;
}

Assistant:

void connect(N* p, nodeit ns) {
        if (ns.size() == 0) return;
        int offset = 0, i = 0;
        while (i < ps.size() and ps[i] != p) offset += osi[i++];

        if (i == ps.size()) {ps.push_back(p); osi.push_back(ns.size());}
        else ++osi[i];

        os.insert(os.begin() + offset, ns.begin(), ns.end());
    }